

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

int FIX::socket_bind(socket_handle socket,char *hostname,int port)

{
  int iVar1;
  undefined1 local_2c [4];
  socklen_t socklen;
  sockaddr_in address;
  int port_local;
  char *hostname_local;
  socket_handle socket_local;
  
  local_2c._0_2_ = 2;
  address.sin_zero._0_4_ = port;
  unique0x10000059 = hostname;
  local_2c._2_2_ = htons((uint16_t)port);
  if ((stack0xffffffffffffffe8 == (char *)0x0) || (*stack0xffffffffffffffe8 == '\0')) {
    socklen = 0;
  }
  else {
    socklen = inet_addr(stack0xffffffffffffffe8);
  }
  iVar1 = bind(socket,(sockaddr *)local_2c,0x10);
  return iVar1;
}

Assistant:

int socket_bind(socket_handle socket, const char *hostname, int port) {
  sockaddr_in address;
  socklen_t socklen;

  address.sin_family = PF_INET;
  address.sin_port = htons(port);
  if (!hostname || !*hostname) {
    address.sin_addr.s_addr = INADDR_ANY;
  } else {
    address.sin_addr.s_addr = inet_addr(hostname);
  }
  socklen = sizeof(address);

  return bind(socket, reinterpret_cast<sockaddr *>(&address), socklen);
}